

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5AsciiCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  Fts5Tokenizer *__dest;
  long lVar4;
  int iVar5;
  byte *pbVar6;
  long lVar7;
  
  iVar5 = 1;
  if ((nArg & 1U) == 0) {
    iVar3 = sqlite3_initialize();
    if ((iVar3 == 0) &&
       (__dest = (Fts5Tokenizer *)sqlite3Malloc(0x80), __dest != (Fts5Tokenizer *)0x0)) {
      memcpy(__dest,"",0x80);
      if (0 < nArg) {
        lVar4 = 0;
LAB_001d7c92:
        pcVar2 = azArg[lVar4];
        if (pcVar2 != (char *)0x0) {
          pbVar6 = (byte *)azArg[lVar4 + 1];
          lVar7 = 0;
          do {
            bVar1 = pcVar2[lVar7];
            if (bVar1 == "tokenchars"[lVar7]) {
              if ((ulong)bVar1 == 0) goto LAB_001d7ccc;
            }
            else if (""[bVar1] != ""[(byte)"tokenchars"[lVar7]]) {
              lVar7 = 0;
              goto LAB_001d7cf5;
            }
            lVar7 = lVar7 + 1;
          } while( true );
        }
LAB_001d7d4f:
        sqlite3_free(__dest);
        goto LAB_001d7d57;
      }
LAB_001d7d4b:
      iVar5 = 0;
    }
    else {
      __dest = (Fts5Tokenizer *)0x0;
      iVar5 = 7;
    }
  }
  else {
LAB_001d7d57:
    __dest = (Fts5Tokenizer *)0x0;
  }
  *ppOut = __dest;
  return iVar5;
LAB_001d7cf5:
  bVar1 = pcVar2[lVar7];
  if (bVar1 == "separators"[lVar7]) {
    if ((ulong)bVar1 == 0) goto LAB_001d7d1a;
  }
  else if (""[bVar1] != ""[(byte)"separators"[lVar7]]) goto LAB_001d7d4f;
  lVar7 = lVar7 + 1;
  goto LAB_001d7cf5;
LAB_001d7d1a:
  bVar1 = *pbVar6;
  while (bVar1 != 0) {
    pbVar6 = pbVar6 + 1;
    if (-1 < (char)bVar1) {
      __dest[bVar1] = (Fts5Tokenizer)0x0;
    }
    bVar1 = *pbVar6;
  }
  goto LAB_001d7d3e;
LAB_001d7ccc:
  bVar1 = *pbVar6;
  while (bVar1 != 0) {
    pbVar6 = pbVar6 + 1;
    if (-1 < (char)bVar1) {
      __dest[bVar1] = (Fts5Tokenizer)0x1;
    }
    bVar1 = *pbVar6;
  }
LAB_001d7d3e:
  lVar4 = lVar4 + 2;
  if (nArg <= (int)lVar4) goto LAB_001d7d4b;
  goto LAB_001d7c92;
}

Assistant:

static int fts5AsciiCreate(
  void *pUnused, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;
  AsciiTokenizer *p = 0;
  UNUSED_PARAM(pUnused);
  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = sqlite3_malloc(sizeof(AsciiTokenizer));
    if( p==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int i;
      memset(p, 0, sizeof(AsciiTokenizer));
      memcpy(p->aTokenChar, aAsciiTokenChar, sizeof(aAsciiTokenChar));
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          fts5AsciiAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          fts5AsciiAddExceptions(p, zArg, 0);
        }else{
          rc = SQLITE_ERROR;
        }
      }
      if( rc!=SQLITE_OK ){
        fts5AsciiDelete((Fts5Tokenizer*)p);
        p = 0;
      }
    }
  }

  *ppOut = (Fts5Tokenizer*)p;
  return rc;
}